

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_collider.cpp
# Opt level: O2

void __thiscall
embree::sse2::BVHNCollider<4>::collide_recurse_entry
          (BVHNCollider<4> *this,NodeRef ref0,BBox3fa *bounds0,NodeRef ref1,BBox3fa *bounds1)

{
  BBox3fa *pBVar1;
  Vec3fa *pVVar2;
  void *ptr;
  char cVar3;
  CollideJob *pCVar4;
  runtime_error *this_00;
  size_t sVar5;
  uint uVar6;
  size_t sVar7;
  size_t i;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  size_t i_3;
  CollideJob *pCVar11;
  ulong uVar12;
  jobvector *pjVar13;
  size_t sVar14;
  BVHNCollider<4> *this_01;
  long lVar15;
  size_t i_1;
  ulong uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 *puStack_1c0;
  size_t local_1b8;
  ulong local_1b0;
  jobvector local_1a8;
  size_t local_180;
  ulong uStack_178;
  void *local_170;
  uint local_15c;
  uint local_158;
  uint local_154;
  BVHNCollider<4> *local_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined8 local_118;
  float fStack_110;
  float fStack_10c;
  long local_108;
  jobvector *local_100;
  size_t local_f8;
  anon_class_24_3_c7c30120 local_f0;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  anon_class_8_1_898bcfc2_conflict12 local_c0;
  task_group_context context;
  
  local_1a8.size_active = 0;
  local_1a8.size_alloced = 0;
  local_1a8.items = (CollideJob *)0x0;
  local_180 = 0;
  uStack_178 = 0;
  local_170 = (void *)0x0;
  puStack_1c0 = (undefined1 *)0x41a9aa;
  local_150 = this;
  local_1a8.items = (CollideJob *)alignedMalloc(0x38000,0x10);
  pCVar11 = (CollideJob *)0x0;
  for (uVar8 = 0; uVar8 < local_1a8.size_active; uVar8 = uVar8 + 1) {
    puStack_1c0 = (undefined1 *)0x41a9ca;
    CollideJob::CollideJob
              ((CollideJob *)((long)&((local_1a8.items)->ref0).ptr + (long)&(pCVar11->ref0).ptr),
               pCVar11);
    pCVar11 = pCVar11 + 1;
  }
  puStack_1c0 = (undefined1 *)0x41a9da;
  alignedFree((void *)0x0);
  ptr = local_170;
  local_1a8.size_active = 0;
  local_1a8.size_alloced = 0x800;
  if (uStack_178 < 0x800) {
    local_1b8 = local_180;
    puStack_1c0 = (undefined1 *)0x41aa0f;
    local_170 = alignedMalloc(0x38000,0x10);
    lVar15 = 0;
    local_1b0 = ref0.ptr;
    for (uVar8 = 0; uVar8 < local_180; uVar8 = uVar8 + 1) {
      puStack_1c0 = (undefined1 *)0x41aa3a;
      CollideJob::CollideJob
                ((CollideJob *)((long)local_170 + lVar15),(CollideJob *)(lVar15 + (long)ptr));
      lVar15 = lVar15 + 0x70;
    }
    puStack_1c0 = (undefined1 *)0x41aa54;
    alignedFree(ptr);
    local_180 = local_1b8;
    uStack_178 = 0x800;
    ref0.ptr = local_1b0;
  }
  pCVar11 = local_1a8.items;
  sVar7 = local_1a8.size_active;
  fVar22 = (bounds0->lower).field_0.m128[0];
  fVar24 = (bounds0->lower).field_0.m128[1];
  fVar26 = (bounds0->lower).field_0.m128[2];
  fVar28 = (bounds0->lower).field_0.m128[3];
  fVar29 = (bounds0->upper).field_0.m128[0];
  fVar30 = (bounds0->upper).field_0.m128[1];
  fVar31 = (bounds0->upper).field_0.m128[2];
  fVar32 = (bounds0->upper).field_0.m128[3];
  fVar17 = (bounds1->lower).field_0.m128[0];
  fVar18 = (bounds1->lower).field_0.m128[1];
  fVar19 = (bounds1->lower).field_0.m128[2];
  fVar20 = (bounds1->lower).field_0.m128[3];
  fVar21 = (bounds1->upper).field_0.m128[0];
  fVar23 = (bounds1->upper).field_0.m128[1];
  fVar25 = (bounds1->upper).field_0.m128[2];
  fVar27 = (bounds1->upper).field_0.m128[3];
  uVar8 = local_1a8.size_active + 1;
  if (local_1a8.size_alloced < uVar8) {
    uVar16 = local_1a8.size_alloced;
    uVar12 = uVar8;
    if (local_1a8.size_alloced != 0) {
      for (; uVar12 = uVar16, uVar16 < uVar8; uVar16 = uVar16 * 2 + (ulong)(uVar16 * 2 == 0)) {
      }
    }
    if (local_1a8.size_alloced != uVar12) {
      puStack_1c0 = (undefined1 *)0x41aaf7;
      local_1b8 = ref1.ptr;
      local_1b0 = ref0.ptr;
      local_148 = fVar29;
      fStack_144 = fVar30;
      fStack_140 = fVar31;
      fStack_13c = fVar32;
      local_138 = fVar22;
      fStack_134 = fVar24;
      fStack_130 = fVar26;
      fStack_12c = fVar28;
      local_128 = fVar21;
      fStack_124 = fVar23;
      fStack_120 = fVar25;
      fStack_11c = fVar27;
      local_118 = *(size_t *)&(bounds1->lower).field_0;
      fStack_110 = fVar19;
      fStack_10c = fVar20;
      local_1a8.items = (CollideJob *)alignedMalloc(uVar12 * 0x70,0x10);
      lVar15 = 0;
      for (uVar16 = 0; uVar16 < local_1a8.size_active; uVar16 = uVar16 + 1) {
        puStack_1c0 = (undefined1 *)0x41ab1a;
        CollideJob::CollideJob
                  ((CollideJob *)((long)&((local_1a8.items)->ref0).ptr + lVar15),
                   (CollideJob *)((long)&(pCVar11->ref0).ptr + lVar15));
        lVar15 = lVar15 + 0x70;
      }
      puStack_1c0 = (undefined1 *)0x41ab2b;
      alignedFree(pCVar11);
      local_1a8.size_alloced = uVar12;
      ref1.ptr = local_1b8;
      ref0.ptr = local_1b0;
      fVar17 = (float)local_118;
      fVar18 = local_118._4_4_;
      fVar19 = fStack_110;
      fVar20 = fStack_10c;
      fVar21 = local_128;
      fVar23 = fStack_124;
      fVar25 = fStack_120;
      fVar27 = fStack_11c;
      fVar22 = local_138;
      fVar24 = fStack_134;
      fVar26 = fStack_130;
      fVar28 = fStack_12c;
      fVar29 = local_148;
      fVar30 = fStack_144;
      fVar31 = fStack_140;
      fVar32 = fStack_13c;
    }
  }
  local_1a8.size_active = uVar8;
  local_1a8.items[sVar7].ref0.ptr = ref0.ptr;
  pBVar1 = &local_1a8.items[sVar7].bounds0;
  (pBVar1->lower).field_0.m128[0] = fVar22;
  (pBVar1->lower).field_0.m128[1] = fVar24;
  (pBVar1->lower).field_0.m128[2] = fVar26;
  (pBVar1->lower).field_0.m128[3] = fVar28;
  pBVar1 = &local_1a8.items[sVar7].bounds0;
  (pBVar1->upper).field_0.m128[0] = fVar29;
  (pBVar1->upper).field_0.m128[1] = fVar30;
  (pBVar1->upper).field_0.m128[2] = fVar31;
  (pBVar1->upper).field_0.m128[3] = fVar32;
  local_1a8.items[sVar7].depth0 = 0;
  local_1a8.items[sVar7].ref1.ptr = ref1.ptr;
  pBVar1 = &local_1a8.items[sVar7].bounds1;
  (pBVar1->lower).field_0.m128[0] = fVar17;
  (pBVar1->lower).field_0.m128[1] = fVar18;
  (pBVar1->lower).field_0.m128[2] = fVar19;
  (pBVar1->lower).field_0.m128[3] = fVar20;
  pBVar1 = &local_1a8.items[sVar7].bounds1;
  (pBVar1->upper).field_0.m128[0] = fVar21;
  (pBVar1->upper).field_0.m128[1] = fVar23;
  (pBVar1->upper).field_0.m128[2] = fVar25;
  (pBVar1->upper).field_0.m128[3] = fVar27;
  local_1a8.items[sVar7].depth1 = 0;
  this_01 = local_150;
  local_154 = 0;
  uVar6 = 1;
  while( true ) {
    sVar7 = (&local_1a8)[local_154].size_active;
    if (0x800 < sVar7 + 8) break;
    local_15c = local_154;
    local_158 = uVar6;
    uVar8 = (ulong)uVar6;
    local_108 = uVar8 * 0x20;
    pjVar13 = &local_1a8 + local_154;
    local_100 = pjVar13;
    uVar16 = 0;
    while (uVar16 <= sVar7 && sVar7 - uVar16 != 0) {
      pCVar11 = pjVar13->items + uVar16;
      sVar5 = (&local_1a8)[uVar8].size_active;
      local_1b0 = uVar16;
      if (((sVar7 - uVar16) + sVar5) - 0x7f9 < 0xfffffffffffff7ff) {
        sVar7 = (pCVar11->ref0).ptr;
        fVar22 = (pCVar11->bounds0).lower.field_0.m128[0];
        fVar24 = (pCVar11->bounds0).lower.field_0.m128[1];
        fVar26 = (pCVar11->bounds0).lower.field_0.m128[2];
        fVar28 = (pCVar11->bounds0).lower.field_0.m128[3];
        fVar29 = (pCVar11->bounds0).upper.field_0.m128[0];
        fVar30 = (pCVar11->bounds0).upper.field_0.m128[1];
        fVar31 = (pCVar11->bounds0).upper.field_0.m128[2];
        fVar32 = (pCVar11->bounds0).upper.field_0.m128[3];
        context.my_cpu_ctl_env = pCVar11->depth0;
        context._8_8_ = (pCVar11->ref1).ptr;
        fVar17 = (pCVar11->bounds1).lower.field_0.m128[0];
        fVar18 = (pCVar11->bounds1).lower.field_0.m128[1];
        fVar19 = (pCVar11->bounds1).lower.field_0.m128[2];
        fVar20 = (pCVar11->bounds1).lower.field_0.m128[3];
        fVar21 = (pCVar11->bounds1).upper.field_0.m128[0];
        fVar23 = (pCVar11->bounds1).upper.field_0.m128[1];
        fVar25 = (pCVar11->bounds1).upper.field_0.m128[2];
        fVar27 = (pCVar11->bounds1).upper.field_0.m128[3];
        sVar14 = pCVar11->depth1;
        uVar16 = sVar5 + 1;
        uVar12 = (&local_1a8)[uVar8].size_alloced;
        if (uVar12 < uVar16) {
          uVar9 = uVar12;
          uVar10 = uVar16;
          if (uVar12 != 0) {
            for (; uVar10 = uVar9, uVar9 < uVar16; uVar9 = uVar9 * 2 + (ulong)(uVar9 * 2 == 0)) {
            }
          }
          if (uVar12 != uVar10) {
            local_f8 = sVar14;
            local_d8 = fVar21;
            fStack_d4 = fVar23;
            fStack_d0 = fVar25;
            fStack_cc = fVar27;
            local_148 = fVar17;
            fStack_144 = fVar18;
            fStack_140 = fVar19;
            fStack_13c = fVar20;
            local_138 = fVar29;
            fStack_134 = fVar30;
            fStack_130 = fVar31;
            fStack_12c = fVar32;
            local_128 = fVar22;
            fStack_124 = fVar24;
            fStack_120 = fVar26;
            fStack_11c = fVar28;
            local_118 = sVar7;
            pCVar11 = (&local_1a8)[uVar8].items;
            puStack_1c0 = (undefined1 *)0x41acc3;
            local_1b8 = sVar5;
            pCVar4 = (CollideJob *)alignedMalloc(uVar10 * 0x70,0x10);
            (&local_1a8)[uVar8].items = pCVar4;
            lVar15 = 0;
            for (uVar12 = 0; uVar12 < (&local_1a8)[uVar8].size_active; uVar12 = uVar12 + 1) {
              puStack_1c0 = (undefined1 *)0x41ace2;
              CollideJob::CollideJob
                        ((CollideJob *)((long)&(((&local_1a8)[uVar8].items)->ref0).ptr + lVar15),
                         (CollideJob *)((long)&(pCVar11->ref0).ptr + lVar15));
              lVar15 = lVar15 + 0x70;
            }
            puStack_1c0 = (undefined1 *)0x41acf3;
            alignedFree(pCVar11);
            pjVar13 = local_100;
            this_01 = local_150;
            (&local_1a8)[uVar8].size_alloced = uVar10;
            sVar5 = local_1b8;
            sVar7 = local_118;
            sVar14 = local_f8;
            fVar22 = local_128;
            fVar24 = fStack_124;
            fVar26 = fStack_120;
            fVar28 = fStack_11c;
            fVar29 = local_138;
            fVar30 = fStack_134;
            fVar31 = fStack_130;
            fVar32 = fStack_12c;
            fVar17 = local_148;
            fVar18 = fStack_144;
            fVar19 = fStack_140;
            fVar20 = fStack_13c;
            fVar21 = local_d8;
            fVar23 = fStack_d4;
            fVar25 = fStack_d0;
            fVar27 = fStack_cc;
          }
        }
        pCVar11 = (&local_1a8)[uVar8].items;
        (&local_1a8)[uVar8].size_active = uVar16;
        pCVar11[sVar5].ref0.ptr = sVar7;
        pBVar1 = &pCVar11[sVar5].bounds0;
        (pBVar1->lower).field_0.m128[0] = fVar22;
        (pBVar1->lower).field_0.m128[1] = fVar24;
        (pBVar1->lower).field_0.m128[2] = fVar26;
        (pBVar1->lower).field_0.m128[3] = fVar28;
        pVVar2 = &pCVar11[sVar5].bounds0.upper;
        (pVVar2->field_0).m128[0] = fVar29;
        (pVVar2->field_0).m128[1] = fVar30;
        (pVVar2->field_0).m128[2] = fVar31;
        (pVVar2->field_0).m128[3] = fVar32;
        pCVar11[sVar5].depth0 = context.my_cpu_ctl_env;
        ((NodeRef *)(&pCVar11[sVar5].depth0 + 1))->ptr = context._8_8_;
        pBVar1 = &pCVar11[sVar5].bounds1;
        (pBVar1->lower).field_0.m128[0] = fVar17;
        (pBVar1->lower).field_0.m128[1] = fVar18;
        (pBVar1->lower).field_0.m128[2] = fVar19;
        (pBVar1->lower).field_0.m128[3] = fVar20;
        pVVar2 = &pCVar11[sVar5].bounds1.upper;
        (pVVar2->field_0).m128[0] = fVar21;
        (pVVar2->field_0).m128[1] = fVar23;
        (pVVar2->field_0).m128[2] = fVar25;
        (pVVar2->field_0).m128[3] = fVar27;
        pCVar11[sVar5].depth1 = sVar14;
      }
      else {
        puStack_1c0 = (undefined1 *)0x41ac74;
        split(this_01,pCVar11,&local_1a8 + uVar8);
      }
      sVar7 = pjVar13->size_active;
      uVar16 = local_1b0 + 1;
    }
    if (*(ulong *)((long)&local_1a8.size_active + local_108) == sVar7) break;
    pjVar13->size_active = 0;
    local_154 = local_158;
    uVar6 = local_15c;
  }
  local_f0.jobs = (jobvector (*) [2])&local_1a8;
  local_f0.source = (int *)&local_154;
  puStack_1c0 = (undefined1 *)0x41add2;
  local_f0.this = this_01;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  local_c0.func = &local_f0;
  puStack_1c0 = (undefined1 *)0x41adfa;
  tbb::detail::d1::
  parallel_for<unsigned_long,embree::parallel_for<unsigned_long,embree::sse2::BVHNCollider<4>::collide_recurse_entry(embree::NodeRefPtr<4>,embree::BBox<embree::Vec3fa>const&,embree::NodeRefPtr<4>,embree::BBox<embree::Vec3fa>const&)::_lambda(unsigned_long)_1_>(unsigned_long,embree::sse2::BVHNCollider<4>::collide_recurse_entry(embree::NodeRefPtr<4>,embree::BBox<embree::Vec3fa>const&,embree::NodeRefPtr<4>,embree::BBox<embree::Vec3fa>const&)::_lambda(unsigned_long)_1_const&)::_lambda(unsigned_long)_1_>
            (0,sVar7,1,&local_c0,&context);
  puStack_1c0 = (undefined1 *)0x41ae07;
  cVar3 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar3 != '\0') {
    puStack_1c0 = (undefined1 *)0x41ae53;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    puStack_1c0 = (undefined1 *)0x41ae65;
    std::runtime_error::runtime_error(this_00,"task cancelled");
    puStack_1c0 = &LAB_0041ae7b;
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  puStack_1c0 = (undefined1 *)0x41ae18;
  tbb::detail::d1::task_group_context::~task_group_context(&context);
  lVar15 = 0x40;
  do {
    puStack_1c0 = (undefined1 *)0x41ae25;
    alignedFree(*(void **)((long)&local_1b0 + lVar15));
    *(undefined8 *)((long)&puStack_1c0 + lVar15) = 0;
    *(undefined8 *)((long)&local_1b8 + lVar15) = 0;
    *(undefined8 *)((long)&local_1b0 + lVar15) = 0;
    lVar15 = lVar15 + -0x20;
  } while (lVar15 != 0);
  return;
}

Assistant:

void BVHNCollider<N>::collide_recurse_entry(NodeRef ref0, const BBox3fa& bounds0, NodeRef ref1, const BBox3fa& bounds1)
    {
      CSTAT(bvh_collide_traversal_steps = 0);
      CSTAT(bvh_collide_leaf_pairs = 0);
      CSTAT(bvh_collide_leaf_iterations = 0);
      CSTAT(bvh_collide_prim_intersections1 = 0);
      CSTAT(bvh_collide_prim_intersections2 = 0);
      CSTAT(bvh_collide_prim_intersections3 = 0);
      CSTAT(bvh_collide_prim_intersections4 = 0);
      CSTAT(bvh_collide_prim_intersections5 = 0);
      CSTAT(bvh_collide_prim_intersections = 0);
#if 0
      collide_recurse(ref0,bounds0,ref1,bounds1,0,0);
#else
      const int M = 2048;
      jobvector jobs[2];
      jobs[0].reserve(M);
      jobs[1].reserve(M);
      jobs[0].push_back(CollideJob(ref0,bounds0,0,ref1,bounds1,0));
      int source = 0;
      int target = 1;

      /* try to split job until job list is full */
      while (jobs[source].size()+8 <= M)
      {
        for (size_t i=0; i<jobs[source].size(); i++)
        {
          const CollideJob& job = jobs[source][i];
          size_t remaining = jobs[source].size()-i;
          if (jobs[target].size()+remaining+8 > M) {
            jobs[target].push_back(job);
          } else {
            split(job,jobs[target]);
          }
        }

        /* stop splitting jobs if we reached only leaves and cannot make progress anymore */
        if (jobs[target].size() == jobs[source].size())
          break;

        jobs[source].resize(0);
        std::swap(source,target);
      }

      /* parallel processing of all jobs */
      parallel_for(size_t(jobs[source].size()), [&] ( size_t i ) {
          CollideJob& j = jobs[source][i];
          collide_recurse(j.ref0,j.bounds0,j.ref1,j.bounds1,j.depth0,j.depth1);
        });
      
      
#endif
      CSTAT(PRINT(bvh_collide_traversal_steps));
      CSTAT(PRINT(bvh_collide_leaf_pairs));
      CSTAT(PRINT(bvh_collide_leaf_iterations));
      CSTAT(PRINT(bvh_collide_prim_intersections1));
      CSTAT(PRINT(bvh_collide_prim_intersections2));
      CSTAT(PRINT(bvh_collide_prim_intersections3));
      CSTAT(PRINT(bvh_collide_prim_intersections4));
      CSTAT(PRINT(bvh_collide_prim_intersections5));
      CSTAT(PRINT(bvh_collide_prim_intersections));
    }